

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O2

void wasm::ReReloop::BlockTask::handle(ReReloop *parent,Block *curr)

{
  Block *target;
  ulong index;
  Block *curr_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined1 auStack_48 [8];
  shared_ptr<wasm::ReReloop::BlockTask> task;
  
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    std::make_shared<wasm::ReReloop::BlockTask,wasm::ReReloop&,wasm::Block*&>
              ((ReReloop *)auStack_48,(Block **)parent);
    (((Name *)((long)auStack_48 + 0x10))->super_IString).str._M_len = (size_t)curr;
    target = makeCFGBlock(parent);
    *(Block **)((long)auStack_48 + 0x18) = target;
    addBreakTarget(parent,(Name)(curr->name).super_IString.str,target);
    std::__shared_ptr<wasm::ReReloop::Task,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<wasm::ReReloop::BlockTask,void>
              ((__shared_ptr<wasm::ReReloop::Task,(__gnu_cxx::_Lock_policy)2> *)&curr_local,
               (__shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2> *)auStack_48);
    std::
    vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
    ::emplace_back<std::shared_ptr<wasm::ReReloop::Task>>
              ((vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
                *)&parent->stack,(shared_ptr<wasm::ReReloop::Task> *)&curr_local);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
  }
  index = (ulong)(uint)(curr->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements;
  while (0 < (int)index) {
    index = index - 1;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
              (&(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,index);
    std::make_shared<wasm::ReReloop::TriageTask,wasm::ReReloop&,wasm::Expression*&>
              ((ReReloop *)&curr_local,(Expression **)parent);
    auStack_48 = (undefined1  [8])curr_local;
    task.super___shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Stack_50._M_pi;
    curr_local = (Block *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
    ::emplace_back<std::shared_ptr<wasm::ReReloop::Task>>
              ((vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
                *)&parent->stack,(shared_ptr<wasm::ReReloop::Task> *)auStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  }
  return;
}

Assistant:

static void handle(ReReloop& parent, Block* curr) {
      if (curr->name.is()) {
        // we may be branched to. create a target, and
        // ensure we are called at the join point
        auto task = std::make_shared<BlockTask>(parent, curr);
        task->curr = curr;
        task->later = parent.makeCFGBlock();
        parent.addBreakTarget(curr->name, task->later);
        parent.stack.push_back(task);
      }
      auto& list = curr->list;
      for (int i = int(list.size()) - 1; i >= 0; i--) {
        parent.stack.push_back(std::make_shared<TriageTask>(parent, list[i]));
      }
    }